

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O0

RBFKernel * __thiscall CoreML::Specification::Kernel::mutable_rbfkernel(Kernel *this)

{
  bool bVar1;
  RBFKernel *this_00;
  Kernel *this_local;
  
  bVar1 = has_rbfkernel(this);
  if (!bVar1) {
    clear_kernel(this);
    set_has_rbfkernel(this);
    this_00 = (RBFKernel *)operator_new(0x20);
    RBFKernel::RBFKernel(this_00);
    (this->kernel_).rbfkernel_ = this_00;
  }
  return (RBFKernel *)(this->kernel_).linearkernel_;
}

Assistant:

inline ::CoreML::Specification::RBFKernel* Kernel::mutable_rbfkernel() {
  if (!has_rbfkernel()) {
    clear_kernel();
    set_has_rbfkernel();
    kernel_.rbfkernel_ = new ::CoreML::Specification::RBFKernel;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Kernel.rbfKernel)
  return kernel_.rbfkernel_;
}